

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O0

HRESULT __thiscall ConfigParser::SetOutputFile(ConfigParser *this,WCHAR *outputFile,WCHAR *openMode)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  DWORD DVar4;
  int iVar5;
  size_t sVar6;
  WCHAR *_Dst;
  size_t sVar7;
  size_t sVar8;
  PAL_FILE *file;
  undefined4 *puVar9;
  WCHAR *local_698;
  PAL_FILE *fp;
  char16 *fileNameOnly;
  char16 moduleName [260];
  WCHAR local_458 [4];
  char16 fileName [260];
  size_t bufferLen;
  WCHAR *pDest;
  size_t pidStartPosition;
  WCHAR buffer [260];
  WCHAR *pidStr;
  WCHAR *openMode_local;
  WCHAR *outputFile_local;
  ConfigParser *this_local;
  
  buffer[0x100] = L'\0';
  buffer[0x101] = L'\0';
  buffer[0x102] = L'\0';
  buffer[0x103] = L'\0';
  buffer._512_8_ = PAL_wcsstr(outputFile,L"{PID}");
  openMode_local = outputFile;
  if ((char16_t *)buffer._512_8_ != (char16_t *)0x0) {
    sVar6 = buffer._512_8_ - (long)outputFile >> 1;
    fileName[0x100] = L'Ą';
    fileName[0x101] = L'\0';
    fileName[0x102] = L'\0';
    fileName[0x103] = L'\0';
    wcsncpy_s((WCHAR *)&pidStartPosition,0x104,outputFile,sVar6);
    _Dst = (WCHAR *)((long)&pidStartPosition + sVar6 * 2);
    fileName._512_8_ = fileName._512_8_ - sVar6;
    DVar4 = GetCurrentProcessId();
    _itow_s(DVar4,_Dst,0x104 - sVar6,10);
    sVar7 = PAL_wcslen(_Dst);
    uVar2 = fileName._512_8_;
    sVar8 = PAL_wcslen(_Dst + sVar7);
    fileName._512_8_ = uVar2 - sVar8;
    wcscpy_s(_Dst + sVar7,fileName._512_8_,outputFile + sVar6 + 5);
    openMode_local = (WCHAR *)&pidStartPosition;
  }
  PlatformAgnostic::SystemInfo::GetBinaryLocation((char16 *)&fileNameOnly,0x104);
  _wsplitpath_s((WCHAR *)&fileNameOnly,(WCHAR *)0x0,0,(WCHAR *)0x0,0,local_458,0x104,(WCHAR *)0x0,0)
  ;
  iVar5 = _wcsicmp(local_458,L"WWAHost");
  if ((((iVar5 != 0) && (iVar5 = _wcsicmp(local_458,L"ByteCodeGenerator"), iVar5 != 0)) &&
      (iVar5 = _wcsicmp(local_458,L"spartan"), iVar5 != 0)) &&
     (iVar5 = _wcsicmp(local_458,L"spartan_edge"), iVar5 != 0)) {
    sVar6 = PAL_wcslen(L"MicrosoftEdge");
    iVar5 = _wcsnicmp(local_458,L"MicrosoftEdge",sVar6);
    if (iVar5 != 0) goto LAB_003f1992;
  }
  DVar4 = GetEnvironmentVariableW(L"temp",local_458,0x104);
  if (DVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                       ,700,"(0)","Get temp environment failed");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  else {
    wcscat_s(local_458,0x104,L"\\");
    local_698 = PAL_wcsrchr(openMode_local,L'\\');
    if (local_698 == (char16_t *)0x0) {
      local_698 = openMode_local;
    }
    wcscat_s(local_458,0x104,local_698);
  }
  openMode_local = local_458;
LAB_003f1992:
  file = _wfsopen(openMode_local,openMode,0x20);
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                       ,0x2c8,"(false)","Could not open file for logging output.");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
    this_local._4_4_ = -0x7fffbffb;
  }
  else {
    Output::SetOutputFile(file);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

HRESULT ConfigParser::SetOutputFile(const WCHAR* outputFile, const WCHAR* openMode)
{
    // If present, replace the {PID} token with the process ID
    const WCHAR* pidStr = nullptr;
    WCHAR buffer[_MAX_PATH];
    if ((pidStr = wcsstr(outputFile, _u("{PID}"))) != nullptr)
    {
        size_t pidStartPosition = pidStr - outputFile;

        WCHAR* pDest = buffer;
        size_t bufferLen = _MAX_PATH;

        // Copy the filename before the {PID} token
        wcsncpy_s(pDest, bufferLen, outputFile, pidStartPosition);
        pDest += pidStartPosition;
        bufferLen = bufferLen - pidStartPosition;

        // Copy the PID
        _itow_s(GetCurrentProcessId(), pDest, /*bufferSize=*/_MAX_PATH - pidStartPosition, /*radix=*/10);
#pragma prefast(suppress: 26014, "ultow string length is smaller than 256")
        pDest += wcslen(pDest);
        bufferLen = bufferLen - wcslen(pDest);

        // Copy the rest of the string.
#pragma prefast(suppress: 26014, "Overwriting pDset's null terminator is intentional since the string being copied is null terminated")
        wcscpy_s(pDest, bufferLen, outputFile + pidStartPosition + /*length of {PID}*/ 5);

        outputFile = buffer;
    }

    char16 fileName[_MAX_PATH];
    char16 moduleName[_MAX_PATH];
    PlatformAgnostic::SystemInfo::GetBinaryLocation(moduleName, _MAX_PATH);
    _wsplitpath_s(moduleName, nullptr, 0, nullptr, 0, fileName, _MAX_PATH, nullptr, 0);
    if (_wcsicmp(fileName, _u("WWAHost")) == 0 ||
        _wcsicmp(fileName, _u("ByteCodeGenerator")) == 0 ||
        _wcsicmp(fileName, _u("spartan")) == 0 ||
        _wcsicmp(fileName, _u("spartan_edge")) == 0 ||
        _wcsnicmp(fileName, _u("MicrosoftEdge"), wcslen(_u("MicrosoftEdge"))) == 0)
    {

        // we need to output to %temp% directory in wwa. we don't have permission otherwise.
        if (GetEnvironmentVariable(_u("temp"), fileName, _MAX_PATH) != 0)
        {
            wcscat_s(fileName, _MAX_PATH, _u("\\"));
            const char16 * fileNameOnly = wcsrchr(outputFile, _u('\\'));
            // if outputFile is full path we just need filename, discard the path
            wcscat_s(fileName, _MAX_PATH, fileNameOnly == nullptr ? outputFile : fileNameOnly);
        }
        else
        {
            AssertMsg(FALSE, "Get temp environment failed");
        }
        outputFile = fileName;
    }

    FILE *fp;
    if ((fp = _wfsopen(outputFile, openMode, _SH_DENYWR)) != nullptr)
    {
        Output::SetOutputFile(fp);
        return S_OK;
    }

    AssertMsg(false, "Could not open file for logging output.");
    return E_FAIL;
}